

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

void legacy::getLineCriteriaNodes
               (LLVMDependenceGraph *dg,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *criteria,
               set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
               *nodes)

{
  bool bVar1;
  ulong uVar2;
  char *__nptr;
  reference this;
  LLVMNode *__x;
  undefined8 in_RSI;
  LLVMDependenceGraph *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::LLVMNode_*>,_bool> pVar3;
  LLVMDependenceGraph *unaff_retaddr;
  LLVMNode *nd_1;
  IIty *I;
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  __end2;
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  __begin2;
  inst_range *__range2;
  pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*> *it;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *__range1_2;
  LLVMNode *nd;
  GlobalVariable *G;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  __end1_1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  __begin1_1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
  *__range1_1;
  int line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *crit;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parsedCrit;
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  *in_stack_fffffffffffffe88;
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea1;
  string *in_stack_fffffffffffffea8;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  *in_stack_fffffffffffffeb0;
  char in_stack_fffffffffffffec7;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  in_stack_fffffffffffffec8;
  Instruction *in_stack_fffffffffffffed0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  in_stack_fffffffffffffed8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  in_stack_fffffffffffffee0;
  GlobalVariable *in_stack_fffffffffffffee8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  in_stack_fffffffffffffef0;
  _Self local_d8;
  _Self local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  _Base_ptr local_b8;
  undefined1 local_b0;
  LLVMNode *local_a8;
  reference local_a0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  local_98;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  local_90;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
  local_88;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
  *local_78;
  int local_70;
  undefined4 local_6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  undefined8 local_38;
  undefined8 local_10;
  LLVMDependenceGraph *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1e19cc);
  local_38 = local_10;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe88);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe90,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe88), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
    splitList((string *)in_stack_fffffffffffffec8.NodePtr,in_stack_fffffffffffffec7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_68,0);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_68,0);
      bVar1 = isNumber(in_stack_fffffffffffffea8);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_68,0);
        __nptr = (char *)std::__cxx11::string::c_str();
        local_70 = atoi(__nptr);
        if (0 < local_70) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_68,1);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<int&,std::__cxx11::string&>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                     (int *)in_stack_fffffffffffffe98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe90);
        }
      }
      else {
        llvm::errs();
        in_stack_fffffffffffffe90 =
             (InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
              *)llvm::raw_ostream::operator<<
                          ((raw_ostream *)
                           CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                           (char *)in_stack_fffffffffffffe98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_68,0);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                   (char *)in_stack_fffffffffffffe98);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                   (char *)in_stack_fffffffffffffe98);
      }
    }
    else {
      local_6c = 0xffffffff;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_68,1);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<int,std::__cxx11::string&>
                ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                 (int *)in_stack_fffffffffffffe98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe90);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_40);
  }
  initDebugInfo(unaff_retaddr);
  ::dg::LLVMDependenceGraph::getModule(local_8);
  local_88 = llvm::Module::globals
                       ((Module *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0));
  local_78 = &local_88;
  local_90 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
             ::begin(local_78);
  local_98 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
             ::end(local_78);
  while (bVar1 = llvm::operator!=(&local_90,&local_98), bVar1) {
    local_a0 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                            *)0x1e1c36);
    bVar1 = globalMatchesCrit(in_stack_fffffffffffffee8,
                              (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffee0.NodePtr);
    if (bVar1) {
      local_a8 = ::dg::DependenceGraph<dg::LLVMNode>::getGlobalNode
                           ((DependenceGraph<dg::LLVMNode> *)in_stack_fffffffffffffe90,
                            (KeyT)in_stack_fffffffffffffe88);
      pVar3 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
              insert(in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
      local_b8 = (_Base_ptr)pVar3.first._M_node;
      local_b0 = pVar3.second;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                  *)in_stack_fffffffffffffe90);
  }
  bVar1 = std::
          map<const_llvm::Value_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<const_llvm::Value_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1e1cba);
  if (bVar1) {
    local_bc = 1;
  }
  else {
    local_c8 = ::dg::getConstructedFunctions();
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
         ::begin((map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
                  *)in_stack_fffffffffffffe88);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
         ::end((map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
                *)in_stack_fffffffffffffe88);
    while (bVar1 = std::operator!=(&local_d0,&local_d8), bVar1) {
      std::_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
      operator*((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                 *)0x1e1d32);
      llvm::cast<llvm::Function,llvm::Value>((Value *)0x1e1d4a);
      llvm::instructions((Function *)in_stack_fffffffffffffef0.NodePtr);
      llvm::
      iterator_range<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>
      ::begin((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
               *)&stack0xfffffffffffffed0,
              (iterator_range<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>
               *)&stack0xfffffffffffffee8);
      llvm::
      iterator_range<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>
      ::end((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
             *)&stack0xfffffffffffffeb8,
            (iterator_range<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>
             *)&stack0xfffffffffffffee8);
      while (bVar1 = llvm::
                     InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                     ::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88), bVar1) {
        this = llvm::
               InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
               ::operator*((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                            *)0x1e1da7);
        bVar1 = instMatchesCrit((LLVMDependenceGraph *)in_stack_fffffffffffffed8.NodePtr,
                                in_stack_fffffffffffffed0,
                                (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffec8.NodePtr);
        if (bVar1) {
          __x = ::dg::DependenceGraph<dg::LLVMNode>::getNode
                          ((DependenceGraph<dg::LLVMNode> *)in_stack_fffffffffffffe90,
                           (KeyT)in_stack_fffffffffffffe88);
          pVar3 = std::
                  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
                  insert((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                          *)this,(value_type *)__x);
          in_stack_fffffffffffffea0 = pVar3.second;
        }
        llvm::
        InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
        ::operator++(in_stack_fffffffffffffe90);
      }
      std::_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
      operator++((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                  *)in_stack_fffffffffffffe90);
    }
    local_bc = 0;
  }
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0));
  return;
}

Assistant:

static void getLineCriteriaNodes(LLVMDependenceGraph &dg,
                                 std::vector<std::string> &criteria,
                                 std::set<LLVMNode *> &nodes) {
    assert(!criteria.empty() && "No criteria given");

    std::vector<std::pair<int, std::string>> parsedCrit;
    for (auto &crit : criteria) {
        auto parts = splitList(crit, ':');
        assert(parts.size() == 2);

        // parse the line number
        if (parts[0].empty()) {
            // global variable
            parsedCrit.emplace_back(-1, parts[1]);
        } else if (isNumber(parts[0])) {
            int line = atoi(parts[0].c_str());
            if (line > 0)
                parsedCrit.emplace_back(line, parts[1]);
        } else {
            llvm::errs()
                    << "Invalid line: '" << parts[0] << "'. "
                    << "Needs to be a number or empty for global variables.\n";
        }
    }

    assert(!parsedCrit.empty() && "Failed parsing criteria");

    initDebugInfo(dg);

    // try match globals
    for (auto &G : dg.getModule()->globals()) {
        if (globalMatchesCrit(G, parsedCrit)) {
            LLVMNode *nd = dg.getGlobalNode(&G);
            assert(nd);
            nodes.insert(nd);
        }
    }

    // we do not have any mapping, we will not match anything
    if (valuesToVariables.empty()) {
        return;
    }

    // map line criteria to nodes
    for (const auto &it : getConstructedFunctions()) {
        for (auto &I :
             llvm::instructions(*llvm::cast<llvm::Function>(it.first))) {
            if (instMatchesCrit(dg, I, parsedCrit)) {
                LLVMNode *nd = it.second->getNode(&I);
                assert(nd);
                nodes.insert(nd);
            }
        }
    }
}